

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool __thiscall IR::Instr::AreAllOpndInt64(Instr *this)

{
  IRType IVar1;
  bool local_23;
  bool local_22;
  bool local_21;
  bool local_14;
  bool isSrc2Int64;
  bool isSrc1Int64;
  bool isDstInt64;
  Instr *this_local;
  
  local_14 = true;
  if (this->m_dst != (Opnd *)0x0) {
    IVar1 = Opnd::GetType(this->m_dst);
    local_14 = IRType_IsInt64(IVar1);
  }
  local_21 = true;
  if (this->m_src1 != (Opnd *)0x0) {
    IVar1 = Opnd::GetType(this->m_src1);
    local_21 = IRType_IsInt64(IVar1);
  }
  local_22 = true;
  if (this->m_src2 != (Opnd *)0x0) {
    IVar1 = Opnd::GetType(this->m_src2);
    local_22 = IRType_IsInt64(IVar1);
  }
  local_23 = false;
  if ((local_14 != false) && (local_23 = false, local_21 != false)) {
    local_23 = local_22;
  }
  return local_23;
}

Assistant:

bool Instr::AreAllOpndInt64() const
{
    bool isDstInt64 = !m_dst || IRType_IsInt64(m_dst->GetType());
    bool isSrc1Int64 = !m_src1 || IRType_IsInt64(m_src1->GetType());
    bool isSrc2Int64 = !m_src2 || IRType_IsInt64(m_src2->GetType());
    return isDstInt64 && isSrc1Int64 && isSrc2Int64;
}